

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_parser.hpp
# Opt level: O1

void __thiscall
example::push_parser<printing_callbacks>::parse(push_parser<printing_callbacks> *this)

{
  undefined1 *this_00;
  bool bVar1;
  value vVar2;
  long value;
  double value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->field_0x148;
  do {
    vVar2 = trial::protocol::json::basic_reader<char>::symbol(&this->reader);
    switch(vVar2) {
    case null:
      printing_callbacks::on_null((printing_callbacks *)this_00);
      break;
    case boolean:
      bVar1 = trial::protocol::json::basic_reader<char>::value<bool>(&this->reader);
      printing_callbacks::on_boolean((printing_callbacks *)this_00,bVar1);
      break;
    case integer:
      value = trial::protocol::json::basic_reader<char>::value<long>(&this->reader);
      printing_callbacks::on_integer((printing_callbacks *)this_00,value);
      break;
    case real:
      value_00 = trial::protocol::json::basic_reader<char>::value<double>(&this->reader);
      printing_callbacks::on_real((printing_callbacks *)this_00,value_00);
      break;
    case string:
    case key:
      trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
                (&local_48,&this->reader);
      printing_callbacks::on_string((printing_callbacks *)this_00,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      break;
    case begin_array:
      printing_callbacks::on_begin_array((printing_callbacks *)this_00);
      break;
    case end_array:
      printing_callbacks::on_end_array((printing_callbacks *)this_00);
      break;
    case begin_object:
      printing_callbacks::on_begin_object((printing_callbacks *)this_00);
      break;
    case end_object:
      printing_callbacks::on_end_object((printing_callbacks *)this_00);
    }
    bVar1 = trial::protocol::json::basic_reader<char>::next(&this->reader);
  } while (bVar1);
  return;
}

Assistant:

void parse()
    {
        do
        {
            switch (reader.symbol())
            {
            case json::token::symbol::null:
                callbacks.on_null();
                break;

            case json::token::symbol::boolean:
                callbacks.on_boolean(reader.value<bool>());
                break;

            case json::token::symbol::integer:
                callbacks.on_integer(reader.value<std::intmax_t>());
                break;

            case json::token::symbol::real:
                callbacks.on_real(reader.value<double>());
                break;

            case json::token::symbol::key:
            case json::token::symbol::string:
                callbacks.on_string(reader.value<std::string>());
                break;

            case json::token::symbol::begin_array:
                callbacks.on_begin_array();
                break;

            case json::token::symbol::end_array:
                callbacks.on_end_array();
                break;

            case json::token::symbol::begin_object:
                callbacks.on_begin_object();
                break;

            case json::token::symbol::end_object:
                callbacks.on_end_object();
                break;

            default:
                break;
            }

        } while (reader.next());
    }